

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

void __thiscall
Js::JavascriptStackWalker::SetCurrentFunction
          (JavascriptStackWalker *this,JavascriptFunction *function)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void **ppvVar4;
  
  if (((*(ushort *)&this->field_0x50 >> 2 | *(ushort *)&this->field_0x50) & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x421,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((this->field_0x50 & 1) != 0) {
    InlinedFrameWalker::SetFunctionObject(&this->inlinedFrameWalker,function);
    return;
  }
  ppvVar4 = GetCurrentArgv(this);
  *ppvVar4 = function;
  return;
}

Assistant:

void JavascriptStackWalker::SetCurrentFunction(JavascriptFunction * function)
    {
        Assert(this->IsJavascriptFrame());
#if ENABLE_NATIVE_CODEGEN
        if (inlinedFramesBeingWalked)
        {
            inlinedFrameWalker.SetFunctionObject(function);
        }
        else
#endif
        {
            this->GetCurrentArgv()[JavascriptFunctionArgIndex_Function] = function;
        }
    }